

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::EntryRaw(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  RecyclableObject *instance;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  ulong uVar8;
  JavascriptString *pJVar9;
  uint64 uVar10;
  uint64 uVar11;
  uint uVar12;
  uint idxArg;
  ulong uVar13;
  double value;
  int in_stack_00000010;
  undefined1 local_2a0 [8];
  Builder<256U> stringBuilder;
  RecyclableObject *callSite;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  Var rawVar;
  RecyclableObject *local_38;
  RecyclableObject *raw;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x616,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d25327;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_68,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x619,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d25327:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((ulong)local_68 & 0xfffffe) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)local_68,1);
    BVar4 = JavascriptConversion::ToObject
                      (pvVar7,pSVar1,(RecyclableObject **)&stringBuilder.isFinalized);
    if (BVar4 != 0) {
      iVar5 = (**(code **)(*(long *)stringBuilder._544_8_ + 0x90))
                        (stringBuilder._544_8_,stringBuilder._544_8_,0x12a,&callInfo_local,0,pSVar1)
      ;
      if (iVar5 != 1) {
        callInfo_local =
             (CallInfo)
             (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
      }
      BVar4 = JavascriptConversion::ToObject((Var)callInfo_local,pSVar1,&local_38);
      if (BVar4 != 0) {
        pvVar7 = JavascriptOperators::OP_GetLength(local_38,pSVar1);
        uVar8 = JavascriptConversion::ToLength(pvVar7,pSVar1);
        if ((long)uVar8 < 1) {
          pJVar9 = JavascriptLibrary::GetEmptyString
                             ((pSVar1->super_ScriptContextBase).javascriptLibrary);
        }
        else {
          pvVar7 = JavascriptOperators::OP_GetElementI_UInt32(local_38,0,pSVar1);
          pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
          if (uVar8 != 1) {
            CompoundString::Builder<256U>::Builder((Builder<256U> *)local_2a0,pSVar1);
            if (stringBuilder._520_8_ == 0) {
              CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                        (pJVar9,(Builder<256U> *)local_2a0,false);
            }
            else {
              CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
            }
            uVar12 = local_68._0_4_ & 0xffffff;
            uVar13 = 0xfffffffe;
            if ((long)uVar8 < 0xfffffffe) {
              uVar13 = uVar8;
            }
            iVar5 = 2;
            if (2 < (uVar13 & 0xffffffff)) {
              iVar5 = (int)uVar13;
            }
            uVar13 = 1;
            idxArg = 2;
            do {
              if (idxArg < uVar12) {
                pvVar7 = Arguments::operator[]((Arguments *)local_68,idxArg);
                pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
                if (stringBuilder._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (pJVar9,(Builder<256U> *)local_2a0,false);
                }
                else {
                  CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
                }
              }
              pvVar7 = JavascriptOperators::OP_GetElementI_UInt32(local_38,(uint32)uVar13,pSVar1);
              pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
              if (stringBuilder._520_8_ == 0) {
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (pJVar9,(Builder<256U> *)local_2a0,false);
              }
              else {
                CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
              }
              uVar13 = uVar13 + 1;
              idxArg = idxArg + 1;
            } while (iVar5 != (int)uVar13);
            if ((long)uVar13 < (long)uVar8) {
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              do {
                instance = local_38;
                if ((long)(int)uVar13 == uVar13) {
                  pvVar7 = (Var)(uVar13 & 0xffffffff | 0x1000000000000);
                }
                else {
                  value = (double)(long)uVar13;
                  uVar10 = NumberUtilities::ToSpecial(value);
                  bVar3 = NumberUtilities::IsNan(value);
                  if (((bVar3) &&
                      (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0xfff8000000000000)) &&
                     (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0x7ff8000000000000)) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar6 = 1;
                    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                                ,0xa2,
                                                "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                                ,"We should only produce a NaN with this value");
                    if (!bVar3) goto LAB_00d25327;
                    *puVar6 = 0;
                  }
                  pvVar7 = (Var)(uVar10 ^ 0xfffc000000000000);
                }
                pvVar7 = JavascriptOperators::OP_GetElementI(instance,pvVar7,pSVar1);
                pJVar9 = JavascriptConversion::ToString(pvVar7,pSVar1);
                if (stringBuilder._520_8_ == 0) {
                  CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                            (pJVar9,(Builder<256U> *)local_2a0,false);
                }
                else {
                  CompoundString::Append((CompoundString *)stringBuilder._520_8_,pJVar9);
                }
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
            pJVar9 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_2a0);
          }
        }
        return pJVar9;
      }
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec36,L"String.raw");
}

Assistant:

Var JavascriptString::EntryRaw(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        RecyclableObject* callSite;
        RecyclableObject* raw;
        Var rawVar;

        // Call ToObject on the first argument to get the callSite (which is also cooked string array)
        // ToObject returns false if the parameter is null or undefined
        if (!JavascriptConversion::ToObject(args[1], scriptContext, &callSite))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        // Get the raw property from the callSite object
        if (!callSite->GetProperty(callSite, Js::PropertyIds::raw, &rawVar, nullptr, scriptContext))
        {
            rawVar = scriptContext->GetLibrary()->GetUndefined();
        }

        if (!JavascriptConversion::ToObject(rawVar, scriptContext, &raw))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        int64 length = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(raw, scriptContext), scriptContext);

        // If there are no raw strings (somehow), return empty string
        if (length <= 0)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Get the first raw string
        Var var = JavascriptOperators::OP_GetElementI_UInt32(raw, 0, scriptContext);
        JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);

        // If there is only one raw string, just return that one raw string (doesn't matter if there are replacements)
        if (length == 1)
        {
            return string;
        }

        // We aren't going to bail early so let's create a StringBuilder and put the first raw string in there
        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> stringBuilder(scriptContext);
        stringBuilder.Append(string);

        // Each raw string is followed by a substitution expression except for the last one
        // We will always have one more string constant than substitution expression
        // `strcon1 ${expr1} strcon2 ${expr2} strcon3` = strcon1 + expr1 + strcon2 + expr2 + strcon3
        //
        // strcon1 --- step 1 (above)
        // expr1   \__ step 2
        // strcon2 /
        // expr2   \__ step 3
        // strcon3 /
        const auto append = [&] (Var var)
        {
            JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);
                stringBuilder.Append(string);
        };
        uint32 loopMax = length >= UINT_MAX ? UINT_MAX-1 : (uint32)length;
        uint32 i = 1;
        uint32 argsCount = args.Info.Count;
        for (; i < loopMax; ++i)
        {
            // First append the next substitution expression if available
            if (i + 1 < argsCount)
            {
                append(args[i + 1]);
            }

            // Then append the next string (this will also cover the final string case)
            append(JavascriptOperators::OP_GetElementI_UInt32(raw, i, scriptContext));
        }

        // Length can be greater than uint32 max (unlikely in practice)
        for (int64 j = (int64)i; j < length; ++j)
        {
            // Append whatever is left in the array/object
            append(JavascriptOperators::OP_GetElementI(raw, JavascriptNumber::ToVar(j, scriptContext), scriptContext));
        }

        // CompoundString::Builder has saved our lives
        return stringBuilder.ToString();
    }